

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O3

int __thiscall QGuiApplicationPrivate::init(QGuiApplicationPrivate *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  QGuiApplication *app;
  int *piVar2;
  QChar *pQVar3;
  char16_t *pcVar4;
  undefined8 uVar5;
  qsizetype qVar6;
  QArrayData *pQVar7;
  Data *pDVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  storage_type *psVar14;
  QOpenGLContext *pQVar15;
  void *pvVar16;
  QObject *pQVar17;
  QSessionManager *this_00;
  code *pcVar18;
  undefined4 *puVar19;
  ImplFn p_Var20;
  long lVar21;
  long lVar22;
  storage_type *psVar23;
  longlong lVar24;
  QArrayData *pQVar25;
  QArrayDataPointer<QByteArray> *ctx_00;
  int iVar26;
  char *b;
  char *pcVar27;
  long in_FS_OFFSET;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  uint local_1a4;
  QObject local_190 [8];
  QArrayData *local_188;
  undefined1 *puStack_180;
  undefined1 *local_178;
  QArrayData *local_168;
  undefined8 uStack_160;
  long local_158;
  QString local_148;
  QString local_128;
  QArrayDataPointer<QByteArray> local_108;
  QArrayDataPointer<QByteArray> local_e8;
  char *local_d0;
  QArrayData *local_c0;
  storage_type *local_b8;
  storage_type *local_b0;
  QString local_a8;
  QArrayData *local_90;
  storage_type *local_88;
  storage_type *local_80;
  QString local_78;
  QSlotObjectBase local_58;
  storage_type *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplicationPrivate::init();
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  local_108.size = 0;
  local_108.d = (Data *)0x0;
  local_108.ptr = (QByteArray *)0x0;
  local_128.d.size = 0;
  local_128.d.d = (Data *)0x0;
  local_128.d.ptr = (char16_t *)0x0;
  local_148.d.size = 0;
  local_148.d.d = (Data *)0x0;
  local_148.d.ptr = (char16_t *)0x0;
  bVar9 = false;
  local_158 = 0;
  local_168 = (QArrayData *)0x0;
  uStack_160 = 0;
  iVar12 = **(int **)&this->field_0x80;
  local_1a4 = (uint)(iVar12 != 0);
  if (1 < iVar12) {
    iVar26 = 1;
    bVar9 = false;
    do {
      lVar21 = *(long *)&this->field_0x88;
      lVar22 = (long)iVar26;
      pcVar1 = *(char **)(lVar21 + lVar22 * 8);
      if (pcVar1 != (char *)0x0) {
        if (*pcVar1 == '-') {
          pcVar27 = pcVar1 + 1;
          if (pcVar1[1] != '-') {
            pcVar27 = pcVar1;
          }
          iVar11 = strcmp(pcVar27,"-plugin");
          if (iVar11 == 0) {
            iVar26 = iVar26 + 1;
            pQVar25 = local_168;
            if (iVar26 < iVar12) {
              QByteArray::QByteArray
                        ((QByteArray *)&local_e8,*(char **)(lVar21 + (long)iVar26 * 8),-1);
              QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                        ((QMovableArrayOps<QByteArray> *)&local_108,local_108.size,
                         (QByteArray *)&local_e8);
              QList<QByteArray>::end((QList<QByteArray> *)&local_108);
              piVar2 = (int *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
              pQVar25 = local_168;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_),1,0x10);
                  pQVar25 = local_168;
                }
              }
            }
          }
          else {
            iVar11 = strcmp(pcVar27,"-reverse");
            if (iVar11 == 0) {
              force_reverse = 1;
              pQVar25 = local_168;
            }
            else {
              iVar11 = strcmp(pcVar27,"-session");
              if ((iVar11 == 0) && (iVar26 < iVar12 + -1)) {
                iVar26 = iVar26 + 1;
                pcVar1 = *(char **)(lVar21 + 8 + lVar22 * 8);
                pQVar25 = local_168;
                if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
                  psVar23 = (storage_type *)0xffffffffffffffff;
                  do {
                    pcVar27 = pcVar1 + 1 + (long)psVar23;
                    psVar23 = psVar23 + 1;
                  } while (*pcVar27 != '\0');
                  QVar28.m_data = psVar23;
                  QVar28.m_size = (qsizetype)&local_e8;
                  QString::fromLatin1(QVar28);
                  pDVar8 = local_128.d.d;
                  pQVar25 = (QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
                  pQVar3 = (QChar *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
                  local_e8.d._0_4_ = SUB84(local_128.d.d,0);
                  local_e8.d._4_4_ = (undefined4)((ulong)local_128.d.d >> 0x20);
                  uVar13 = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
                  local_e8.ptr._0_4_ = SUB84(local_128.d.ptr,0);
                  local_e8.ptr._4_4_ = (undefined4)((ulong)local_128.d.ptr >> 0x20);
                  local_e8.size._0_4_ = (undefined4)local_128.d.size;
                  local_e8.size._4_4_ = (undefined4)((ulong)local_128.d.size >> 0x20);
                  local_128.d.ptr = (char16_t *)pQVar3;
                  local_128.d.size = uVar13;
                  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_128.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      local_128.d.d = (Data *)pQVar25;
                      QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                      pQVar25 = &(local_128.d.d)->super_QArrayData;
                    }
                  }
                  local_128.d.d = (Data *)pQVar25;
                  local_e8.d._0_4_ = (undefined4)local_128.d.size;
                  local_e8.d._4_4_ = (undefined4)((ulong)local_128.d.size >> 0x20);
                  local_e8.ptr._0_4_ = SUB84(local_128.d.ptr,0);
                  local_e8.ptr._4_4_ = (undefined4)((ulong)local_128.d.ptr >> 0x20);
                  uVar13 = QStringView::indexOf
                                     ((QStringView *)&local_e8,(QChar)0x5f,0,CaseSensitive);
                  pQVar25 = &(local_128.d.d)->super_QArrayData;
                  if (-1 < (long)uVar13) {
                    QString::mid((longlong)&local_e8,(longlong)&local_128);
                    pDVar8 = local_148.d.d;
                    pQVar25 = (QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
                    pcVar4 = (char16_t *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
                    local_e8.d._0_4_ = SUB84(local_148.d.d,0);
                    local_e8.d._4_4_ = (undefined4)((ulong)local_148.d.d >> 0x20);
                    qVar6 = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
                    local_e8.ptr._0_4_ = SUB84(local_148.d.ptr,0);
                    local_e8.ptr._4_4_ = (undefined4)((ulong)local_148.d.ptr >> 0x20);
                    local_e8.size._0_4_ = (undefined4)local_148.d.size;
                    local_e8.size._4_4_ = (undefined4)((ulong)local_148.d.size >> 0x20);
                    local_148.d.ptr = pcVar4;
                    local_148.d.size = qVar6;
                    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_148.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        local_148.d.d = (Data *)pQVar25;
                        QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                        pQVar25 = &(local_148.d.d)->super_QArrayData;
                      }
                    }
                    local_148.d.d = (Data *)pQVar25;
                    if (uVar13 < (ulong)local_128.d.size) {
                      QString::QString((QString *)&local_e8,(QChar *)local_128.d.ptr,uVar13);
                    }
                    else {
                      local_e8.d._0_4_ = SUB84(local_128.d.d,0);
                      local_e8.d._4_4_ = (undefined4)((ulong)local_128.d.d >> 0x20);
                      local_e8.ptr._0_4_ = SUB84(local_128.d.ptr,0);
                      local_e8.ptr._4_4_ = (undefined4)((ulong)local_128.d.ptr >> 0x20);
                      local_e8.size._0_4_ = (undefined4)local_128.d.size;
                      local_e8.size._4_4_ = (undefined4)((ulong)local_128.d.size >> 0x20);
                      if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_128.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + 1;
                        UNLOCK();
                      }
                    }
                    pDVar8 = local_128.d.d;
                    pQVar25 = (QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
                    pQVar3 = (QChar *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
                    local_e8.d._0_4_ = SUB84(local_128.d.d,0);
                    local_e8.d._4_4_ = (undefined4)((ulong)local_128.d.d >> 0x20);
                    uVar13 = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
                    local_e8.ptr._0_4_ = SUB84(local_128.d.ptr,0);
                    local_e8.ptr._4_4_ = (undefined4)((ulong)local_128.d.ptr >> 0x20);
                    local_e8.size._0_4_ = (undefined4)local_128.d.size;
                    local_e8.size._4_4_ = (undefined4)((ulong)local_128.d.size >> 0x20);
                    local_128.d.ptr = (char16_t *)pQVar3;
                    local_128.d.size = uVar13;
                    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_128.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        local_128.d.d = (Data *)pQVar25;
                        QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                        pQVar25 = &(local_128.d.d)->super_QArrayData;
                      }
                    }
                  }
                  local_128.d.d = (Data *)pQVar25;
                  this->is_session_restored = true;
                  pQVar25 = local_168;
                }
              }
              else {
                iVar11 = strcmp(pcVar27,"-testability");
                if (iVar11 == 0) {
                  bVar9 = true;
                  pQVar25 = local_168;
                }
                else {
                  iVar11 = strncmp(pcVar27,"-style=",7);
                  if (iVar11 == 0) {
                    psVar23 = (storage_type *)0xffffffffffffffff;
                    do {
                      pcVar1 = pcVar27 + 8 + (long)psVar23;
                      psVar23 = psVar23 + 1;
                    } while (*pcVar1 != '\0');
                    QVar29.m_data = psVar23;
                    QVar29.m_size = (qsizetype)&local_e8;
                    QString::fromLocal8Bit(QVar29);
                    pQVar7 = local_168;
                    pQVar25 = (QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
                    uVar5 = CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
                    local_e8.d._0_4_ = SUB84(local_168,0);
                    local_e8.d._4_4_ = (undefined4)((ulong)local_168 >> 0x20);
                    lVar21 = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
                    local_e8.ptr._0_4_ = (undefined4)uStack_160;
                    local_e8.ptr._4_4_ = (undefined4)((ulong)uStack_160 >> 0x20);
                    local_e8.size._0_4_ = (undefined4)local_158;
                    local_e8.size._4_4_ = (undefined4)((ulong)local_158 >> 0x20);
                    uStack_160 = uVar5;
                    local_158 = lVar21;
                    if (local_168 != (QArrayData *)0x0) {
                      LOCK();
                      (local_168->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_168->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_168->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        local_168 = pQVar25;
                        QArrayData::deallocate(pQVar7,2,0x10);
                        pQVar25 = local_168;
                      }
                    }
                  }
                  else {
                    iVar11 = strcmp(pcVar27,"-style");
                    if ((iVar11 == 0) && (iVar26 < iVar12 + -1)) {
                      lVar21 = *(long *)(lVar21 + 8 + lVar22 * 8);
                      if (lVar21 == 0) {
                        psVar23 = (storage_type *)0x0;
                      }
                      else {
                        psVar14 = (storage_type *)0xffffffffffffffff;
                        do {
                          psVar23 = psVar14 + 1;
                          pcVar1 = psVar14 + lVar21 + 1;
                          psVar14 = psVar23;
                        } while (*pcVar1 != '\0');
                      }
                      QVar30.m_data = psVar23;
                      QVar30.m_size = (qsizetype)&local_e8;
                      QString::fromLocal8Bit(QVar30);
                      pQVar7 = local_168;
                      pQVar25 = (QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
                      uVar5 = CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
                      local_e8.d._0_4_ = SUB84(local_168,0);
                      local_e8.d._4_4_ = (undefined4)((ulong)local_168 >> 0x20);
                      lVar21 = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
                      local_e8.ptr._0_4_ = (undefined4)uStack_160;
                      local_e8.ptr._4_4_ = (undefined4)((ulong)uStack_160 >> 0x20);
                      local_e8.size._0_4_ = (undefined4)local_158;
                      local_e8.size._4_4_ = (undefined4)((ulong)local_158 >> 0x20);
                      uStack_160 = uVar5;
                      local_158 = lVar21;
                      if (local_168 != (QArrayData *)0x0) {
                        LOCK();
                        (local_168->ref_)._q_value.super___atomic_base<int>._M_i =
                             (local_168->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((local_168->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                          local_168 = pQVar25;
                          QArrayData::deallocate(pQVar7,2,0x10);
                          pQVar25 = local_168;
                        }
                      }
                      local_168 = pQVar25;
                      iVar26 = iVar26 + 1;
                      pQVar25 = local_168;
                    }
                    else {
                      lVar22 = (long)(int)local_1a4;
                      local_1a4 = local_1a4 + 1;
                      *(char **)(lVar21 + lVar22 * 8) = pcVar1;
                      pQVar25 = local_168;
                    }
                  }
                }
              }
            }
          }
          local_168 = pQVar25;
          if (local_158 != 0) {
            QString::operator=(&styleOverride,(QString *)&local_168);
          }
        }
        else {
          lVar22 = (long)(int)local_1a4;
          local_1a4 = local_1a4 + 1;
          *(char **)(lVar21 + lVar22 * 8) = pcVar1;
        }
      }
      iVar26 = iVar26 + 1;
      iVar12 = **(int **)&this->field_0x80;
    } while (iVar26 < iVar12);
  }
  if ((int)local_1a4 < iVar12) {
    *(undefined8 *)(*(long *)&this->field_0x88 + (long)(int)local_1a4 * 8) = 0;
    **(uint **)&this->field_0x80 = local_1a4;
  }
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  local_188 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_180 = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_188);
  if (local_178 != (undefined1 *)0x0) {
    QByteArray::split((char)&local_e8);
    QList<QByteArray>::operator+=((QList<QByteArray> *)&local_108,(QList<QByteArray> *)&local_e8);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_e8);
  }
  if (platform_integration == (QPlatformIntegration *)0x0) {
    createPlatformIntegration(this);
  }
  updatePalette();
  QFont::initialize();
  initThemeHints();
  QCursorData::initialize();
  qRegisterGuiVariant();
  qRegisterGuiGetInterpolator();
  cVar10 = QCoreApplication::testAttribute(AA_ShareOpenGLContexts);
  if ((cVar10 != '\0') && (pQVar15 = qt_gl_global_share_context(), pQVar15 == (QOpenGLContext *)0x0)
     ) {
    pQVar15 = (QOpenGLContext *)operator_new(0x10);
    QOpenGLContext::QOpenGLContext(pQVar15,(QObject *)0x0);
    QSurfaceFormat::defaultFormat();
    QOpenGLContext::setFormat(pQVar15,(QSurfaceFormat *)&local_e8);
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_e8);
    QOpenGLContext::create(pQVar15);
    qt_gl_set_global_share_context(pQVar15);
    this->ownGlobalShareContext = true;
  }
  QElapsedTimer::start();
  QCoreApplicationPrivate::is_app_running._0_1_ = 1;
  if (local_108.size != 0) {
    lVar21 = 0x10;
    uVar13 = 0;
    do {
      local_58._0_8_ = *(long *)((long)local_108.ptr + lVar21 + -0x10);
      p_Var20 = *(ImplFn *)((long)local_108.ptr + lVar21 + -8);
      psVar23 = *(storage_type **)((long)&((local_108.ptr)->d).d + lVar21);
      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_58._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_58._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_58.m_impl = p_Var20;
      local_48 = psVar23;
      if ((psVar23 == (storage_type *)0x0) ||
         (pvVar16 = memchr(p_Var20,0x3a,(size_t)psVar23),
         (long)pvVar16 - (long)p_Var20 < 0 || pvVar16 == (void *)0x0)) {
        if (p_Var20 == (ImplFn)0x0) {
          psVar23 = (storage_type *)0x0;
        }
        QVar31.m_data = psVar23;
        QVar31.m_size = (qsizetype)&local_e8;
        QString::fromLatin1(QVar31);
        local_78.d.d = (Data *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
        local_78.d.ptr = (char16_t *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
        local_78.d.size = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
        local_e8.d._0_4_ = 0;
        local_e8.d._4_4_ = 0;
        local_e8.ptr._0_4_ = 0;
        local_e8.ptr._4_4_ = 0;
        local_e8.size._0_4_ = 0;
        local_e8.size._4_4_ = 0;
        pQVar17 = QGenericPluginFactory::create(&local_78,(QString *)&local_e8);
        piVar2 = (int *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_),2,0x10)
            ;
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            lVar24 = 2;
            pQVar25 = &(local_78.d.d)->super_QArrayData;
            goto LAB_002cb189;
          }
        }
      }
      else {
        QByteArray::mid((longlong)&local_90,(longlong)&local_58);
        psVar23 = local_88;
        if (local_88 != (storage_type *)0x0) {
          psVar23 = local_80;
        }
        QVar32.m_data = psVar23;
        QVar32.m_size = (qsizetype)&local_e8;
        QString::fromLatin1(QVar32);
        local_78.d.d = (Data *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
        local_78.d.ptr = (char16_t *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
        local_78.d.size = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
        QByteArray::mid((longlong)&local_c0,(longlong)&local_58);
        psVar23 = local_b8;
        if (local_b8 != (storage_type *)0x0) {
          psVar23 = local_b0;
        }
        QVar33.m_data = psVar23;
        QVar33.m_size = (qsizetype)&local_e8;
        QString::fromLatin1(QVar33);
        local_a8.d.d = (Data *)CONCAT44(local_e8.d._4_4_,local_e8.d._0_4_);
        local_a8.d.ptr = (char16_t *)CONCAT44(local_e8.ptr._4_4_,local_e8.ptr._0_4_);
        local_a8.d.size = CONCAT44(local_e8.size._4_4_,(undefined4)local_e8.size);
        pQVar17 = QGenericPluginFactory::create(&local_78,&local_a8);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_c0 != (QArrayData *)0x0) {
          LOCK();
          (local_c0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_c0,1,0x10);
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_90 != (QArrayData *)0x0) {
          LOCK();
          (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            lVar24 = 1;
            pQVar25 = local_90;
LAB_002cb189:
            QArrayData::deallocate(pQVar25,lVar24,0x10);
          }
        }
      }
      if (pQVar17 == (QObject *)0x0) {
        local_e8.d._0_4_ = 2;
        local_e8.d._4_4_ = 0;
        local_e8.ptr._0_4_ = 0;
        local_e8.ptr._4_4_ = 0;
        local_e8.size._0_4_ = 0;
        local_e8.size._4_4_ = 0;
        local_d0 = "default";
        p_Var20 = local_58.m_impl;
        if (local_58.m_impl == (ImplFn)0x0) {
          p_Var20 = (ImplFn)&QByteArray::_empty;
        }
        QMessageLogger::warning((char *)&local_e8,"No such plugin for spec \"%s\"",p_Var20);
      }
      else {
        local_e8.d._0_4_ = SUB84(pQVar17,0);
        local_e8.d._4_4_ = (undefined4)((ulong)pQVar17 >> 0x20);
        QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>
                  ((QPodArrayOps<QObject*> *)&generic_plugin_list,generic_plugin_list.d.size,
                   (QObject **)&local_e8);
        QList<QObject_*>::end(&generic_plugin_list);
      }
      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,1,0x10);
        }
      }
      uVar13 = uVar13 + 1;
      lVar21 = lVar21 + 0x18;
    } while (uVar13 < (ulong)local_108.size);
  }
  QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
  app = *(QGuiApplication **)&this->field_0x8;
  this_00 = (QSessionManager *)operator_new(0x10);
  QSessionManager::QSessionManager(this_00,app,&local_128,&local_148);
  this->session_manager = this_00;
  iVar12 = qEnvironmentVariableIntValue("QT_LOAD_TESTABILITY",(bool *)0x0);
  if (0 < iVar12 || bVar9) {
    local_e8.size._0_4_ = 0xaaaaaaaa;
    local_e8.size._4_4_ = 0xaaaaaaaa;
    local_e8.d._0_4_ = 0xaaaaaaaa;
    local_e8.d._4_4_ = 0xaaaaaaaa;
    local_e8.ptr._0_4_ = 0xaaaaaaaa;
    local_e8.ptr._4_4_ = 0xaaaaaaaa;
    local_58._0_8_ = (QArrayData *)0x0;
    local_58.m_impl = (ImplFn)0x68204c;
    local_48 = (storage_type *)0xd;
    QLibrary::QLibrary((QLibrary *)&local_e8,(QString *)&local_58,(QObject *)0x0);
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    cVar10 = QLibrary::load();
    if (cVar10 == '\0') {
      init((EVP_PKEY_CTX *)&local_e8);
    }
    else {
      ctx_00 = &local_e8;
      pcVar18 = (code *)QLibrary::resolve((char *)ctx_00);
      if (pcVar18 == (code *)0x0) {
        init((EVP_PKEY_CTX *)ctx_00);
      }
      else {
        (*pcVar18)();
      }
    }
    QLibrary::~QLibrary((QLibrary *)&local_e8);
  }
  QGuiApplication::setLayoutDirection(layout_direction);
  if (displayName == (QString *)0x0) {
    local_58._0_8_ = QGuiApplication::applicationDisplayNameChanged;
    local_58.m_impl = (ImplFn)0x0;
    local_e8.d._0_4_ = 0x80f8b8;
    local_e8.d._4_4_ = 0;
    local_e8.ptr._0_4_ = 0;
    local_e8.ptr._4_4_ = 0;
    puVar19 = (undefined4 *)operator_new(0x20);
    *puVar19 = 1;
    *(code **)(puVar19 + 2) =
         QtPrivate::QCallableObject<void_(QGuiApplication::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar19 + 4) = QGuiApplication::applicationDisplayNameChanged;
    *(undefined8 *)(puVar19 + 6) = 0;
    QObject::connectImpl
              (local_190,(void **)app,(QObject *)&local_e8,(void **)app,&local_58,
               (ConnectionType)puVar19,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_190);
  }
  if (local_188 != (QArrayData *)0x0) {
    LOCK();
    (local_188->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_188->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_188->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_188,1,0x10);
    }
  }
  if (local_168 != (QArrayData *)0x0) {
    LOCK();
    (local_168->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_168->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_168->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_168,2,0x10);
    }
  }
  if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

QGuiApplicationPrivate::init()
{
    Q_TRACE_SCOPE(QGuiApplicationPrivate_init);

#if defined(Q_OS_MACOS)
    QMacAutoReleasePool pool;
#endif

    QCoreApplicationPrivate::init();

    QCoreApplicationPrivate::is_app_running = false; // Starting up.

    bool loadTestability = false;
    QList<QByteArray> pluginList;
    // Get command line params
#ifndef QT_NO_SESSIONMANAGER
    QString session_id;
    QString session_key;
# if defined(Q_OS_WIN)
    wchar_t guidstr[40];
    GUID guid;
    CoCreateGuid(&guid);
    StringFromGUID2(guid, guidstr, 40);
    session_id = QString::fromWCharArray(guidstr);
    CoCreateGuid(&guid);
    StringFromGUID2(guid, guidstr, 40);
    session_key = QString::fromWCharArray(guidstr);
# endif
#endif
    QString s;
    int j = argc ? 1 : 0;
    for (int i=1; i<argc; i++) {
        if (!argv[i])
            continue;
        if (*argv[i] != '-') {
            argv[j++] = argv[i];
            continue;
        }
        const char *arg = argv[i];
        if (arg[1] == '-') // startsWith("--")
            ++arg;
        if (strcmp(arg, "-plugin") == 0) {
            if (++i < argc)
                pluginList << argv[i];
        } else if (strcmp(arg, "-reverse") == 0) {
            force_reverse = true;
#ifdef Q_OS_MAC
        } else if (strncmp(arg, "-psn_", 5) == 0) {
            // eat "-psn_xxxx" on Mac, which is passed when starting an app from Finder.
            // special hack to change working directory (for an app bundle) when running from finder
            if (QDir::currentPath() == "/"_L1) {
                QCFType<CFURLRef> bundleURL(CFBundleCopyBundleURL(CFBundleGetMainBundle()));
                QString qbundlePath = QCFString(CFURLCopyFileSystemPath(bundleURL,
                                                                        kCFURLPOSIXPathStyle));
                if (qbundlePath.endsWith(".app"_L1))
                    QDir::setCurrent(qbundlePath.section(u'/', 0, -2));
            }
#endif
#ifndef QT_NO_SESSIONMANAGER
        } else if (strcmp(arg, "-session") == 0 && i < argc - 1) {
            ++i;
            if (argv[i] && *argv[i]) {
                session_id = QString::fromLatin1(argv[i]);
                qsizetype p = session_id.indexOf(u'_');
                if (p >= 0) {
                    session_key = session_id.mid(p +1);
                    session_id = session_id.left(p);
                }
                is_session_restored = true;
            }
#endif
        } else if (strcmp(arg, "-testability") == 0) {
            loadTestability = true;
        } else if (strncmp(arg, "-style=", 7) == 0) {
            s = QString::fromLocal8Bit(arg + 7);
        } else if (strcmp(arg, "-style") == 0 && i < argc - 1) {
            s = QString::fromLocal8Bit(argv[++i]);
        } else {
            argv[j++] = argv[i];
        }

        if (!s.isEmpty())
            styleOverride = s;
    }

    if (j < argc) {
        argv[j] = nullptr;
        argc = j;
    }

    // Load environment exported generic plugins
    QByteArray envPlugins = qgetenv("QT_QPA_GENERIC_PLUGINS");
    if (!envPlugins.isEmpty())
        pluginList += envPlugins.split(',');

    if (platform_integration == nullptr)
        createPlatformIntegration();

    updatePalette();
    QFont::initialize();
    initThemeHints();

#ifndef QT_NO_CURSOR
    QCursorData::initialize();
#endif

    // trigger registering of QVariant's GUI types
    qRegisterGuiVariant();

#if QT_CONFIG(animation)
    // trigger registering of animation interpolators
    qRegisterGuiGetInterpolator();
#endif

    // set a global share context when enabled unless there is already one
#ifndef QT_NO_OPENGL
    if (qApp->testAttribute(Qt::AA_ShareOpenGLContexts) && !qt_gl_global_share_context()) {
        QOpenGLContext *ctx = new QOpenGLContext;
        ctx->setFormat(QSurfaceFormat::defaultFormat());
        ctx->create();
        qt_gl_set_global_share_context(ctx);
        ownGlobalShareContext = true;
    }
#endif

    QWindowSystemInterfacePrivate::eventTime.start();

    is_app_running = true;
    init_plugins(pluginList);
    QWindowSystemInterface::flushWindowSystemEvents();

    Q_Q(QGuiApplication);
#ifndef QT_NO_SESSIONMANAGER
    // connect to the session manager
    session_manager = new QSessionManager(q, session_id, session_key);
#endif

#if QT_CONFIG(library)
    if (qEnvironmentVariableIntValue("QT_LOAD_TESTABILITY") > 0)
        loadTestability = true;

    if (loadTestability) {
        QLibrary testLib(QStringLiteral("qttestability"));
        if (Q_UNLIKELY(!testLib.load())) {
            qCritical() << "Library qttestability load failed:" << testLib.errorString();
        } else {
            typedef void (*TasInitialize)(void);
            TasInitialize initFunction = (TasInitialize)testLib.resolve("qt_testability_init");
            if (Q_UNLIKELY(!initFunction)) {
                qCritical("Library qttestability resolve failed!");
            } else {
                initFunction();
            }
        }
    }
#else
    Q_UNUSED(loadTestability);
#endif // QT_CONFIG(library)

    // trigger changed signal and event delivery
    QGuiApplication::setLayoutDirection(layout_direction);

    if (!QGuiApplicationPrivate::displayName)
        QObject::connect(q, &QGuiApplication::applicationNameChanged,
                         q, &QGuiApplication::applicationDisplayNameChanged);
}